

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int oldParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  long lVar4;
  char *r1;
  uint uVar5;
  
  nb_tests = nb_tests + 1;
  puVar3 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar3 = 0;
  lVar4 = xmlParseFile(filename);
  puVar3 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar3 = 1;
  uVar5 = 1;
  if (lVar4 != 0) {
    r1 = resultFilename(filename,temp_directory,".res");
    if (r1 == (char *)0x0) {
      fwrite("out of memory\n",0xe,1,_stderr);
      fatalError();
    }
    xmlSaveFile(r1,lVar4);
    iVar1 = compareFiles(r1,result);
    xmlFreeDoc(lVar4);
    puVar3 = (undefined4 *)__xmlGetWarningsDefaultValue();
    *puVar3 = 0;
    lVar4 = xmlParseFile(r1);
    puVar3 = (undefined4 *)__xmlGetWarningsDefaultValue();
    *puVar3 = 1;
    if (lVar4 != 0) {
      xmlSaveFile(r1,lVar4);
      iVar2 = compareFiles(r1,result);
      uVar5 = (uint)(iVar2 != 0 || iVar1 != 0);
      xmlFreeDoc(lVar4);
      unlink(r1);
      free(r1);
    }
  }
  return uVar5;
}

Assistant:

static int
oldParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
#ifdef LIBXML_SAX1_ENABLED
    xmlGetWarningsDefaultValue = 0;
    doc = xmlParseFile(filename);
    xmlGetWarningsDefaultValue = 1;
#else
    doc = xmlReadFile(filename, NULL, XML_PARSE_NOWARNING);
#endif
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
#ifdef LIBXML_SAX1_ENABLED
    xmlGetWarningsDefaultValue = 0;
    doc = xmlParseFile(temp);
    xmlGetWarningsDefaultValue = 1;
#else
    doc = xmlReadFile(temp, NULL, XML_PARSE_NOWARNING);
#endif
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}